

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O3

int pk_parse_key_sec1_der
              (mbedtls_pk_context *pk,uchar *key,size_t keylen,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  mbedtls_ecp_group *grp;
  mbedtls_pk_info_t *buflen;
  uchar *buf;
  mbedtls_pk_type_t mVar1;
  int iVar2;
  int iVar3;
  mbedtls_ecp_keypair *key_00;
  uchar *puVar4;
  undefined1 auStack_88 [8];
  mbedtls_asn1_buf params;
  mbedtls_pk_info_t *pmStack_58;
  size_t len;
  undefined8 local_48;
  int local_3c;
  uchar *puStack_38;
  int version;
  uchar *p;
  
  params.len = 0;
  auStack_88 = (undefined1  [8])0x0;
  params.tag = 0;
  params._4_4_ = 0;
  local_48._0_4_ = pk->priv_id;
  local_48._4_4_ = *(undefined4 *)&pk->field_0x14;
  pmStack_58 = pk->pk_info;
  len = (size_t)pk->pk_ctx;
  puStack_38 = key;
  mVar1 = mbedtls_pk_get_type((mbedtls_pk_context *)&stack0xffffffffffffffa8);
  key_00 = (mbedtls_ecp_keypair *)0x0;
  if (mVar1 - MBEDTLS_PK_ECKEY < 3) {
    key_00 = (mbedtls_ecp_keypair *)len;
  }
  iVar2 = mbedtls_asn1_get_tag
                    (&stack0xffffffffffffffc8,key + keylen,(size_t *)&stack0xffffffffffffffa8,0x30);
  if (iVar2 != 0) {
LAB_00227a42:
    return iVar2 + -0x3d00;
  }
  puVar4 = puStack_38 + (long)pmStack_58;
  iVar2 = mbedtls_asn1_get_int(&stack0xffffffffffffffc8,puVar4,&local_3c);
  if (iVar2 != 0) goto LAB_00227a42;
  if (local_3c != 1) {
    return -0x3d80;
  }
  iVar2 = mbedtls_asn1_get_tag(&stack0xffffffffffffffc8,puVar4,(size_t *)&stack0xffffffffffffffa8,4)
  ;
  buf = puStack_38;
  buflen = pmStack_58;
  if (iVar2 != 0) goto LAB_00227a42;
  puStack_38 = puStack_38 + (long)pmStack_58;
  if ((puStack_38 != puVar4) &&
     (iVar2 = mbedtls_asn1_get_tag
                        (&stack0xffffffffffffffc8,puVar4,(size_t *)&stack0xffffffffffffffa8,0xa0),
     iVar2 != -0x62)) {
    if (iVar2 != 0) goto LAB_00227a42;
    iVar2 = pk_get_ecparams(&stack0xffffffffffffffc8,puStack_38 + (long)pmStack_58,
                            (mbedtls_asn1_buf *)auStack_88);
    if (iVar2 != 0) {
      return iVar2;
    }
    iVar2 = pk_use_ecparams((mbedtls_asn1_buf *)auStack_88,pk);
    if (iVar2 != 0) {
      return iVar2;
    }
  }
  iVar2 = mbedtls_ecp_read_key((key_00->grp).id,key_00,buf,(size_t)buflen);
  if (iVar2 != 0) goto LAB_00227a42;
  if ((puStack_38 != puVar4) &&
     (iVar2 = mbedtls_asn1_get_tag
                        (&stack0xffffffffffffffc8,puVar4,(size_t *)&stack0xffffffffffffffa8,0xa1),
     iVar2 != -0x62)) {
    if (iVar2 != 0) goto LAB_00227a42;
    puVar4 = puStack_38 + (long)pmStack_58;
    iVar2 = mbedtls_asn1_get_bitstring_null
                      (&stack0xffffffffffffffc8,puVar4,(size_t *)&stack0xffffffffffffffa8);
    if (iVar2 != 0) goto LAB_00227a42;
    if (puStack_38 + (long)pmStack_58 != puVar4) {
      return -0x3d66;
    }
    iVar2 = pk_get_ecpubkey(&stack0xffffffffffffffc8,puVar4,(mbedtls_pk_context *)pk->pk_ctx);
    if (iVar2 != -0x4e80) {
      iVar3 = -0x3d00;
      goto joined_r0x00227baf;
    }
  }
  grp = (mbedtls_ecp_group *)pk->pk_ctx;
  iVar3 = mbedtls_ecp_mul(grp,(mbedtls_ecp_point *)&grp[1].P.s,(mbedtls_mpi *)(grp + 1),&grp->G,
                          f_rng,p_rng);
  iVar2 = iVar3;
joined_r0x00227baf:
  if (iVar2 != 0) {
    return iVar3;
  }
  return 0;
}

Assistant:

static int pk_parse_key_sec1_der(mbedtls_pk_context *pk,
                                 const unsigned char *key, size_t keylen,
                                 int (*f_rng)(void *, unsigned char *, size_t), void *p_rng)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    int version, pubkey_done;
    size_t len, d_len;
    mbedtls_asn1_buf params = { 0, 0, NULL };
    unsigned char *p = (unsigned char *) key;
    unsigned char *d;
    unsigned char *end = p + keylen;
    unsigned char *end2;
#if defined(MBEDTLS_PK_USE_PSA_EC_DATA)
    psa_key_attributes_t attributes = PSA_KEY_ATTRIBUTES_INIT;
    psa_status_t status;
#else /* MBEDTLS_PK_USE_PSA_EC_DATA */
    mbedtls_ecp_keypair *eck = mbedtls_pk_ec_rw(*pk);
#endif /* MBEDTLS_PK_USE_PSA_EC_DATA */

    /*
     * RFC 5915, or SEC1 Appendix C.4
     *
     * ECPrivateKey ::= SEQUENCE {
     *      version        INTEGER { ecPrivkeyVer1(1) } (ecPrivkeyVer1),
     *      privateKey     OCTET STRING,
     *      parameters [0] ECParameters {{ NamedCurve }} OPTIONAL,
     *      publicKey  [1] BIT STRING OPTIONAL
     *    }
     */
    if ((ret = mbedtls_asn1_get_tag(&p, end, &len,
                                    MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE)) != 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PK_KEY_INVALID_FORMAT, ret);
    }

    end = p + len;

    if ((ret = mbedtls_asn1_get_int(&p, end, &version)) != 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PK_KEY_INVALID_FORMAT, ret);
    }

    if (version != 1) {
        return MBEDTLS_ERR_PK_KEY_INVALID_VERSION;
    }

    if ((ret = mbedtls_asn1_get_tag(&p, end, &len, MBEDTLS_ASN1_OCTET_STRING)) != 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PK_KEY_INVALID_FORMAT, ret);
    }

    /* Keep a reference to the position fo the private key. It will be used
     * later in this function. */
    d = p;
    d_len = len;

    p += len;

    pubkey_done = 0;
    if (p != end) {
        /*
         * Is 'parameters' present?
         */
        if ((ret = mbedtls_asn1_get_tag(&p, end, &len,
                                        MBEDTLS_ASN1_CONTEXT_SPECIFIC | MBEDTLS_ASN1_CONSTRUCTED |
                                        0)) == 0) {
            if ((ret = pk_get_ecparams(&p, p + len, &params)) != 0 ||
                (ret = pk_use_ecparams(&params, pk)) != 0) {
                return ret;
            }
        } else if (ret != MBEDTLS_ERR_ASN1_UNEXPECTED_TAG) {
            return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PK_KEY_INVALID_FORMAT, ret);
        }
    }


#if !defined(MBEDTLS_PK_USE_PSA_EC_DATA)
    if ((ret = mbedtls_ecp_read_key(eck->grp.id, eck, d, d_len)) != 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PK_KEY_INVALID_FORMAT, ret);
    }
#endif

    if (p != end) {
        /*
         * Is 'publickey' present? If not, or if we can't read it (eg because it
         * is compressed), create it from the private key.
         */
        if ((ret = mbedtls_asn1_get_tag(&p, end, &len,
                                        MBEDTLS_ASN1_CONTEXT_SPECIFIC | MBEDTLS_ASN1_CONSTRUCTED |
                                        1)) == 0) {
            end2 = p + len;

            if ((ret = mbedtls_asn1_get_bitstring_null(&p, end2, &len)) != 0) {
                return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PK_KEY_INVALID_FORMAT, ret);
            }

            if (p + len != end2) {
                return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PK_KEY_INVALID_FORMAT,
                                         MBEDTLS_ERR_ASN1_LENGTH_MISMATCH);
            }

            if ((ret = pk_get_ecpubkey(&p, end2, pk)) == 0) {
                pubkey_done = 1;
            } else {
                /*
                 * The only acceptable failure mode of pk_get_ecpubkey() above
                 * is if the point format is not recognized.
                 */
                if (ret != MBEDTLS_ERR_ECP_FEATURE_UNAVAILABLE) {
                    return MBEDTLS_ERR_PK_KEY_INVALID_FORMAT;
                }
            }
        } else if (ret != MBEDTLS_ERR_ASN1_UNEXPECTED_TAG) {
            return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_PK_KEY_INVALID_FORMAT, ret);
        }
    }

#if defined(MBEDTLS_PK_USE_PSA_EC_DATA)
    psa_set_key_type(&attributes, PSA_KEY_TYPE_ECC_KEY_PAIR(pk->ec_family));
    /* Setting largest masks for usage and key algorithms */
    psa_set_key_usage_flags(&attributes, PSA_KEY_USAGE_SIGN_HASH |
                            PSA_KEY_USAGE_SIGN_MESSAGE |
                            PSA_KEY_USAGE_EXPORT | PSA_KEY_USAGE_DERIVE);
#if defined(MBEDTLS_ECDSA_DETERMINISTIC)
    psa_set_key_algorithm(&attributes,
                          PSA_ALG_DETERMINISTIC_ECDSA(PSA_ALG_ANY_HASH));
#else
    psa_set_key_algorithm(&attributes, PSA_ALG_ECDSA(PSA_ALG_ANY_HASH));
#endif
    psa_set_key_enrollment_algorithm(&attributes, PSA_ALG_ECDH);

    status = psa_import_key(&attributes, d, d_len, &pk->priv_id);
    if (status != PSA_SUCCESS) {
        ret = psa_pk_status_to_mbedtls(status);
        return ret;
    }
#endif /* MBEDTLS_PK_USE_PSA_EC_DATA */

    if (!pubkey_done) {
        if ((ret = pk_derive_public_key(pk, d, d_len, f_rng, p_rng)) != 0) {
            return ret;
        }
    }

    return 0;
}